

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoAssembler.cpp
# Opt level: O2

AssemblerReturnValues __thiscall
NanoAssembler::assembleToFile(NanoAssembler *this,string *inputFile,string *outputFile)

{
  pointer pAVar1;
  bool bVar2;
  char cVar3;
  AssemblerReturnValues AVar4;
  pointer pAVar5;
  string *this_00;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> lines;
  string local_2c8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelMap;
  AssemberInstruction inst;
  ofstream file;
  
  lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  labelMap._M_h._M_buckets = &labelMap._M_h._M_single_bucket;
  labelMap._M_h._M_bucket_count = 1;
  labelMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  labelMap._M_h._M_element_count = 0;
  labelMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  labelMap._M_h._M_rehash_policy._M_next_resize = 0;
  labelMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &local_2c8;
  std::__cxx11::string::string((string *)this_00,inputFile);
  bVar2 = readLines((NanoAssembler *)this_00,&local_2c8,&lines,&labelMap);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (bVar2) {
    bVar2 = assemble(this,&lines,&labelMap);
    if (bVar2) {
      std::ofstream::ofstream(&file,(string *)outputFile,_S_out|_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      pAVar1 = lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (cVar3 == '\0') {
        AVar4 = IOError;
      }
      else {
        for (pAVar5 = lines.
                      super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
                      _M_impl.super__Vector_impl_data._M_start; pAVar5 != pAVar1;
            pAVar5 = pAVar5 + 1) {
          AssemberInstruction::AssemberInstruction(&inst,pAVar5);
          std::ostream::write((char *)&file,(long)inst.bytecode);
          std::__cxx11::string::~string((string *)&inst);
        }
        AVar4 = Success;
        std::ofstream::close();
      }
      std::ofstream::~ofstream(&file);
    }
    else {
      AVar4 = AssemblerError;
    }
  }
  else {
    AVar4 = IOError;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&labelMap._M_h);
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::~vector(&lines);
  return AVar4;
}

Assistant:

AssemblerReturnValues NanoAssembler::assembleToFile(std::string inputFile, std::string outputFile) {
	std::vector<AssemberInstruction> lines;
	std::unordered_map<std::string, size_t> labelMap;
	// Load file from disk
	if (!readLines(inputFile, lines, labelMap)) {
		return AssemblerReturnValues::IOError;
	}
	// Compile the file to bytecode
	if (assemble(lines, labelMap)) {
		// Write to disk
		std::ofstream file(outputFile, std::ios::out | std::ios::binary);
		if (file.is_open()) {
			for (AssemberInstruction inst : lines)
				file.write((const char*)& inst.bytecode[0], inst.length);
			file.close();
			return AssemblerReturnValues::Success;
		}
		return AssemblerReturnValues::IOError;
	}
	return AssemblerReturnValues::AssemblerError;
}